

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.c
# Opt level: O1

Integer pnga_create_handle(void)

{
  int iVar1;
  global_array_t *pgVar2;
  int *piVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  
  piVar3 = &GA->actv_handle;
  lVar4 = -1;
  do {
    iVar1 = *piVar3;
    lVar6 = lVar4 + 1;
    if (iVar1 == 0) break;
    lVar5 = lVar4 + 2;
    piVar3 = piVar3 + 0xda;
    lVar4 = lVar6;
  } while (lVar5 < _max_global_array);
  if (iVar1 != 0) {
    pnga_error(" too many arrays ",(long)_max_global_array);
    lVar6 = -1;
  }
  gai_init_struct((int)lVar6);
  pgVar2 = GA;
  GA[lVar6].p_handle = GA_Init_Proc_Group;
  pgVar2[lVar6].ndim = -1;
  pgVar2[lVar6].name[0] = '\0';
  GA[lVar6].mapc = (C_Integer *)0x0;
  pgVar2 = GA;
  GA[lVar6].irreg = 0;
  pgVar2[lVar6].ghosts = 0;
  pgVar2[lVar6].corner_flag = -1;
  pgVar2[lVar6].cache = (double *)0x0;
  pgVar2 = GA;
  GA[lVar6].distr_type = 0;
  pgVar2[lVar6].block_total = -1;
  pgVar2[lVar6].rstrctd_list = (C_Integer *)0x0;
  GA[lVar6].rank_rstrctd = (C_Integer *)0x0;
  pgVar2 = GA;
  GA[lVar6].num_rstrctd = 0;
  pgVar2[lVar6].actv_handle = 1;
  pgVar2[lVar6].has_data = 1;
  pgVar2[lVar6].property = 0;
  return lVar6 + -1000;
}

Assistant:

Integer pnga_create_handle()
{
  Integer ga_handle, i, g_a;
  /*** Get next free global array handle ***/
  ga_handle =-1; i=0;
  do{
      if(!GA[i].actv_handle) ga_handle=i;
      i++;
  }while(i<_max_global_array && ga_handle==-1);
  if( ga_handle == -1)
      pnga_error(" too many arrays ", (Integer)_max_global_array);
  g_a = (Integer)ga_handle - GA_OFFSET;

  /*** fill in Global Info Record for g_a ***/
  gai_init_struct(ga_handle);
  GA[ga_handle].p_handle = GA_Init_Proc_Group;
  GA[ga_handle].ndim = -1;
  GA[ga_handle].name[0] = '\0';
  GA[ga_handle].mapc = NULL;
  GA[ga_handle].irreg = 0;
  GA[ga_handle].ghosts = 0;
  GA[ga_handle].corner_flag = -1;
  GA[ga_handle].cache = NULL;
  GA[ga_handle].distr_type = REGULAR;
  GA[ga_handle].block_total = -1;
  GA[ga_handle].rstrctd_list = NULL;
  GA[ga_handle].rank_rstrctd = NULL;
  GA[ga_handle].num_rstrctd = 0;   /* This is also used as a flag for   */
                                   /* restricted arrays. If it is zero, */
                                   /* then array is not restricted.     */
  GA[ga_handle].actv_handle = 1;
  GA[ga_handle].has_data = 1;
  GA[ga_handle].property = NO_PROPERTY;
  return g_a;
}